

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O2

Error asmjit::v1_14::arm::FormatterInternal::formatRegisterList
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rMask)

{
  uint32_t rId;
  Error EVar1;
  uint uVar2;
  bool bVar3;
  uint32_t rId_00;
  undefined8 uVar4;
  uint uVar5;
  
  uVar4 = 1;
  EVar1 = String::_opChar(sb,kAppend,'{');
  if (EVar1 == 0) {
    bVar3 = true;
    do {
      do {
        if (rMask == 0) {
          EVar1 = String::_opChar(sb,kAppend,'}');
          return EVar1;
        }
        rId = 0;
        if (rMask != 0) {
          for (; (rMask >> rId & 1) == 0; rId = rId + 1) {
          }
        }
        uVar2 = 1 << ((byte)rId & 0x1f);
        rId_00 = rId - 1;
        uVar5 = 0;
        do {
          rMask = rMask & ~uVar2;
          uVar2 = uVar2 * 2;
          uVar5 = uVar5 + 1;
          rId_00 = rId_00 + 1;
        } while ((rMask & uVar2) != 0);
        if ((!bVar3) &&
           (uVar4 = 1, EVar1 = String::_opString(sb,kAppend,", ",0xffffffffffffffff), EVar1 != 0)) {
          return EVar1;
        }
        EVar1 = formatRegister(sb,(FormatFlags)uVar4,emitter,arch,regType,rId,0,0xffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
        bVar3 = false;
      } while (uVar5 < 2);
      uVar4 = 1;
      EVar1 = String::_opChar(sb,kAppend,'-');
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = formatRegister(sb,(FormatFlags)uVar4,emitter,arch,regType,rId_00,0,0xffffffff);
      bVar3 = false;
    } while (EVar1 == 0);
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegisterList(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rMask) noexcept {

  bool first = true;

  ASMJIT_PROPAGATE(sb.append('{'));
  while (rMask != 0u) {
    uint32_t start = Support::ctz(rMask);
    uint32_t count = 0u;

    uint32_t mask = 1u << start;
    do {
      rMask &= ~mask;
      mask <<= 1u;
      count++;
    } while (rMask & mask);

    if (!first)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start, 0, 0xFFFFFFFFu));
    if (count >= 2u) {
      ASMJIT_PROPAGATE(sb.append('-'));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start + count - 1, 0, 0xFFFFFFFFu));
    }

    first = false;
  }
  ASMJIT_PROPAGATE(sb.append('}'));

  return kErrorOk;
}